

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_append_filter.c
# Opt level: O2

int archive_read_append_filter_program_signature
              (archive *_a,char *cmd,void *signature,size_t signature_len)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  char *fmt;
  size_t *psVar4;
  
  iVar1 = archive_read_support_filter_program_signature(_a,cmd,signature,signature_len);
  if (iVar1 == 0) {
    psVar4 = &_a[4].error_string.length;
    for (lVar2 = 0xf8; (int)lVar2 != 0x278; lVar2 = lVar2 + 0x18) {
      if ((*(long *)((long)&_a->magic + lVar2) != 0) && (*(long *)((long)&_a->vtable + lVar2) == 0))
      {
        psVar4 = (size_t *)((long)&_a->magic + lVar2);
        goto LAB_002218da;
      }
    }
    if (*psVar4 == 0) {
      fmt = "Internal error: Unable to append program filter";
      iVar1 = 0x16;
    }
    else {
LAB_002218da:
      pvVar3 = calloc(1,0x90);
      if (pvVar3 != (void *)0x0) {
        *(size_t **)((long)pvVar3 + 8) = psVar4;
        *(archive **)((long)pvVar3 + 0x18) = _a;
        *(size_t *)((long)pvVar3 + 0x10) = _a[4].error_string.length;
        _a[4].error_string.length = (size_t)pvVar3;
        iVar1 = (**(code **)(psVar4[2] + 8))(pvVar3);
        if (iVar1 != 0) {
          __archive_read_free_filters((archive_read *)_a);
          return -0x1e;
        }
        psVar4[1] = *(size_t *)(_a[4].error_string.length + 0x30);
        *(undefined4 *)&_a[4].error_string.buffer_length = 1;
        return 0;
      }
      fmt = "Out of memory";
      iVar1 = 0xc;
    }
    archive_set_error(_a,iVar1,fmt);
  }
  return -0x1e;
}

Assistant:

int
archive_read_append_filter_program_signature(struct archive *_a,
  const char *cmd, const void *signature, size_t signature_len)
{
  int r, number_bidders, i;
  struct archive_read_filter_bidder *bidder;
  struct archive_read_filter *filter;
  struct archive_read *a = (struct archive_read *)_a;

  if (archive_read_support_filter_program_signature(_a, cmd, signature,
    signature_len) != (ARCHIVE_OK))
    return (ARCHIVE_FATAL);

  number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

  bidder = a->bidders;
  for (i = 0; i < number_bidders; i++, bidder++)
  {
    /* Program bidder name set to filter name after initialization */
    if (bidder->data && !bidder->name)
      break;
  }
  if (!bidder->data)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to append program filter");
    return (ARCHIVE_FATAL);
  }

  filter = calloc(1, sizeof(*filter));
  if (filter == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Out of memory");
    return (ARCHIVE_FATAL);
  }
  filter->bidder = bidder;
  filter->archive = a;
  filter->upstream = a->filter;
  a->filter = filter;
  r = (bidder->vtable->init)(a->filter);
  if (r != ARCHIVE_OK) {
    __archive_read_free_filters(a);
    return (ARCHIVE_FATAL);
  }
  bidder->name = a->filter->name;

  a->bypass_filter_bidding = 1;
  return r;
}